

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_keys_values.cpp
# Opt level: O3

ScalarFunction * duckdb::MapKeysFun::GetFunction(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ScalarFunction *in_RDI;
  code *local_158;
  undefined8 local_150;
  code *local_148;
  code *local_140;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_138;
  LogicalType local_118 [24];
  LogicalType local_100 [24];
  LogicalType local_e8;
  undefined1 local_e7;
  undefined8 local_e0;
  undefined8 uStack_d8;
  BaseScalarFunction local_d0 [176];
  
  local_138.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(local_118,LIST);
  local_150 = 0;
  local_158 = MapKeysFunction;
  local_140 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_100,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_100);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,3);
  }
  duckdb::LogicalType::~LogicalType(local_118);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_138);
  in_RDI->field_0xa9 = 1;
  BaseScalarFunction::SetReturnsError(local_d0,&in_RDI->super_BaseScalarFunction);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_d0);
  duckdb::LogicalType::LogicalType(&local_e8,ANY);
  in_RDI->field_0x78 = local_e8;
  in_RDI->field_0x79 = local_e7;
  uVar1 = *(undefined8 *)&in_RDI->field_0x80;
  uVar2 = *(undefined8 *)&in_RDI->field_0x88;
  *(undefined8 *)&in_RDI->field_0x80 = local_e0;
  *(undefined8 *)&in_RDI->field_0x88 = uStack_d8;
  local_e0 = uVar1;
  uStack_d8 = uVar2;
  duckdb::LogicalType::~LogicalType(&local_e8);
  return in_RDI;
}

Assistant:

ScalarFunction MapKeysFun::GetFunction() {
	//! the arguments and return types are actually set in the binder function
	ScalarFunction function({}, LogicalTypeId::LIST, MapKeysFunction, MapKeysBind);
	function.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	BaseScalarFunction::SetReturnsError(function);
	function.varargs = LogicalType::ANY;
	return function;
}